

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O3

bool fs_is_subdir(string_view subdir,string_view dir)

{
  int iVar1;
  bool bVar2;
  string d;
  string s;
  string local_70;
  string local_50;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (dir._M_len == 0 || subdir._M_len == 0) {
    return false;
  }
  fs_drop_slash_abi_cxx11_(&local_50,subdir);
  fs_drop_slash_abi_cxx11_(&local_70,dir);
  if (local_50._M_string_length == local_70._M_string_length) {
    if ((local_50._M_string_length != 0) &&
       (iVar1 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,local_50._M_string_length),
       iVar1 != 0)) {
LAB_001093d2:
      std::__cxx11::string::substr((ulong)&local_30,(ulong)&local_50);
      if (local_28 == local_70._M_string_length) {
        if (local_28 == 0) {
          bVar2 = true;
        }
        else {
          iVar1 = bcmp(local_30,local_70._M_dataplus._M_p,local_28);
          bVar2 = iVar1 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if (local_30 != local_20) {
        operator_delete(local_30,local_20[0] + 1);
      }
      goto LAB_0010943b;
    }
  }
  else if (local_70._M_string_length <= local_50._M_string_length) goto LAB_001093d2;
  bVar2 = false;
LAB_0010943b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool
fs_is_subdir(std::string_view subdir, std::string_view dir)
{
  // is subdir a subdirectory of dir. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(subdir.empty() || dir.empty())
    return false;

  std::string const s = fs_drop_slash(subdir);
  std::string const d = fs_drop_slash(dir);

  if(s == d)
    return false;

  if(s.size() < d.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return s.starts_with(d);
#else
  return s.substr(0, d.size()) == d;
#endif

}